

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

void Js::JavascriptObject::ModifyGetterSetterFuncName
               (PropertyRecord *propertyRecord,PropertyDescriptor *descriptor,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  Var pvVar6;
  ScriptFunction *pSVar7;
  FunctionProxy *pFVar8;
  undefined4 extraout_var_00;
  char16 *pcVar9;
  SetDisplayNameFlags flags_1;
  char16 *finalName_1;
  SetDisplayNameFlags flags;
  char16 *finalName;
  charcount_t propertyLength;
  ScriptContext *scriptContext_local;
  PropertyDescriptor *descriptor_local;
  PropertyRecord *propertyRecord_local;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x844,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (propertyRecord == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x845,"(propertyRecord)","propertyRecord");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = PropertyDescriptor::GetterSpecified(descriptor);
  if ((bVar2) || (bVar2 = PropertyDescriptor::SetterSpecified(descriptor), bVar2)) {
    cVar3 = PropertyRecord::GetLength(propertyRecord);
    bVar2 = PropertyDescriptor::GetterSpecified(descriptor);
    if (bVar2) {
      pvVar6 = PropertyDescriptor::GetGetter(descriptor);
      bVar2 = VarIs<Js::ScriptFunction>(pvVar6);
      if (bVar2) {
        pvVar6 = PropertyDescriptor::GetGetter(descriptor);
        pSVar7 = VarTo<Js::ScriptFunction>(pvVar6);
        pFVar8 = ScriptFunction::GetFunctionProxy(pSVar7);
        iVar4 = (*(pFVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[7])();
        iVar4 = _wcsicmp((char16_t *)CONCAT44(extraout_var,iVar4),L"get");
        if ((iVar4 == 0) &&
           (pcVar9 = ConstructName(propertyRecord,L".get",scriptContext), pcVar9 != (char16 *)0x0))
        {
          pvVar6 = PropertyDescriptor::GetGetter(descriptor);
          pSVar7 = VarTo<Js::ScriptFunction>(pvVar6);
          pFVar8 = ScriptFunction::GetFunctionProxy(pSVar7);
          (*(pFVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[6])(pFVar8,pcVar9,(ulong)(cVar3 + 4),(ulong)(cVar3 + 1),3);
        }
      }
    }
    bVar2 = PropertyDescriptor::SetterSpecified(descriptor);
    if (bVar2) {
      pvVar6 = PropertyDescriptor::GetSetter(descriptor);
      bVar2 = VarIs<Js::ScriptFunction>(pvVar6);
      if (bVar2) {
        pvVar6 = PropertyDescriptor::GetSetter(descriptor);
        pSVar7 = VarTo<Js::ScriptFunction>(pvVar6);
        pFVar8 = ScriptFunction::GetFunctionProxy(pSVar7);
        iVar4 = (*(pFVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[7])();
        iVar4 = _wcsicmp((char16_t *)CONCAT44(extraout_var_00,iVar4),L"set");
        if ((iVar4 == 0) &&
           (pcVar9 = ConstructName(propertyRecord,L".set",scriptContext), pcVar9 != (char16 *)0x0))
        {
          pvVar6 = PropertyDescriptor::GetSetter(descriptor);
          pSVar7 = VarTo<Js::ScriptFunction>(pvVar6);
          pFVar8 = ScriptFunction::GetFunctionProxy(pSVar7);
          (*(pFVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[6])(pFVar8,pcVar9,(ulong)(cVar3 + 4),(ulong)(cVar3 + 1),3);
        }
      }
    }
  }
  return;
}

Assistant:

void JavascriptObject::ModifyGetterSetterFuncName(const PropertyRecord * propertyRecord, const PropertyDescriptor& descriptor, ScriptContext* scriptContext)
{
    Assert(scriptContext);
    Assert(propertyRecord);
    if (descriptor.GetterSpecified() || descriptor.SetterSpecified())
    {
        charcount_t propertyLength = propertyRecord->GetLength();

        if (descriptor.GetterSpecified()
            && Js::VarIs<Js::ScriptFunction>(descriptor.GetGetter())
            && _wcsicmp(Js::VarTo<Js::ScriptFunction>(descriptor.GetGetter())->GetFunctionProxy()->GetDisplayName(), _u("get")) == 0)
        {
            // modify to name.get
            const char16* finalName = ConstructName(propertyRecord, _u(".get"), scriptContext);
            if (finalName != nullptr)
            {
                FunctionProxy::SetDisplayNameFlags flags = (FunctionProxy::SetDisplayNameFlags) (FunctionProxy::SetDisplayNameFlagsDontCopy | FunctionProxy::SetDisplayNameFlagsRecyclerAllocated);

                Js::VarTo<Js::ScriptFunction>(descriptor.GetGetter())->GetFunctionProxy()->SetDisplayName(finalName,
                    propertyLength + 4 /*".get"*/, propertyLength + 1, flags);
            }
        }

        if (descriptor.SetterSpecified()
            && Js::VarIs<Js::ScriptFunction>(descriptor.GetSetter())
            && _wcsicmp(Js::VarTo<Js::ScriptFunction>(descriptor.GetSetter())->GetFunctionProxy()->GetDisplayName(), _u("set")) == 0)
        {
            // modify to name.set
            const char16* finalName = ConstructName(propertyRecord, _u(".set"), scriptContext);
            if (finalName != nullptr)
            {
                FunctionProxy::SetDisplayNameFlags flags = (FunctionProxy::SetDisplayNameFlags) (FunctionProxy::SetDisplayNameFlagsDontCopy | FunctionProxy::SetDisplayNameFlagsRecyclerAllocated);

                Js::VarTo<Js::ScriptFunction>(descriptor.GetSetter())->GetFunctionProxy()->SetDisplayName(finalName,
                    propertyLength + 4 /*".set"*/, propertyLength + 1, flags);
            }
        }
    }
}